

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SegIterSeekInit(Fts5Index *p,u8 *pTerm,int nTerm,int flags,Fts5StructureSegment *pSeg,
                        Fts5SegIter *pIter)

{
  int iVar1;
  uint uVar2;
  sqlite3_stmt *p_00;
  i64 val;
  sqlite3_stmt *pIdxSelect;
  int bDlidx;
  int bGe;
  int iPg;
  Fts5SegIter *pIter_local;
  Fts5StructureSegment *pSeg_local;
  int flags_local;
  int nTerm_local;
  u8 *pTerm_local;
  Fts5Index *p_local;
  
  bDlidx = 1;
  pIdxSelect._4_4_ = 0;
  memset(pIter,0,0x78);
  pIter->pSeg = pSeg;
  p_00 = fts5IdxSelectStmt(p);
  if (p->rc == 0) {
    sqlite3_bind_int(p_00,1,pSeg->iSegid);
    sqlite3_bind_blob(p_00,2,pTerm,nTerm,(_func_void_void_ptr *)0x0);
    iVar1 = sqlite3_step(p_00);
    if (iVar1 == 100) {
      uVar2 = sqlite3_column_int(p_00,0);
      bDlidx = (int)uVar2 >> 1;
      pIdxSelect._4_4_ = uVar2 & 1;
    }
    iVar1 = sqlite3_reset(p_00);
    p->rc = iVar1;
    sqlite3_bind_null(p_00,2);
    if (bDlidx < pSeg->pgnoFirst) {
      bDlidx = pSeg->pgnoFirst;
      pIdxSelect._4_4_ = 0;
    }
    pIter->iLeafPgno = bDlidx + -1;
    fts5SegIterNextPage(p,pIter);
    if (pIter->pLeaf != (Fts5Data *)0x0) {
      fts5LeafSeek(p,flags & 8U,pIter,pTerm,nTerm);
    }
    if (((p->rc == 0) && ((flags & 8U) == 0)) &&
       (pIter->flags = pIter->flags | 1, pIter->pLeaf != (Fts5Data *)0x0)) {
      if ((flags & 2U) != 0) {
        pIter->flags = pIter->flags | 2;
      }
      if (pIdxSelect._4_4_ != 0) {
        fts5SegIterLoadDlidx(p,pIter);
      }
      if ((flags & 2U) != 0) {
        fts5SegIterReverse(p,pIter);
      }
    }
    fts5SegIterSetNext(p,pIter);
  }
  return;
}

Assistant:

static void fts5SegIterSeekInit(
  Fts5Index *p,                   /* FTS5 backend */
  const u8 *pTerm, int nTerm,     /* Term to seek to */
  int flags,                      /* Mask of FTS5INDEX_XXX flags */
  Fts5StructureSegment *pSeg,     /* Description of segment */
  Fts5SegIter *pIter              /* Object to populate */
){
  int iPg = 1;
  int bGe = (flags & FTS5INDEX_QUERY_SCAN);
  int bDlidx = 0;                 /* True if there is a doclist-index */
  sqlite3_stmt *pIdxSelect = 0;

  assert( bGe==0 || (flags & FTS5INDEX_QUERY_DESC)==0 );
  assert( pTerm && nTerm );
  memset(pIter, 0, sizeof(*pIter));
  pIter->pSeg = pSeg;

  /* This block sets stack variable iPg to the leaf page number that may
  ** contain term (pTerm/nTerm), if it is present in the segment. */
  pIdxSelect = fts5IdxSelectStmt(p);
  if( p->rc ) return;
  sqlite3_bind_int(pIdxSelect, 1, pSeg->iSegid);
  sqlite3_bind_blob(pIdxSelect, 2, pTerm, nTerm, SQLITE_STATIC);
  if( SQLITE_ROW==sqlite3_step(pIdxSelect) ){
    i64 val = sqlite3_column_int(pIdxSelect, 0);
    iPg = (int)(val>>1);
    bDlidx = (val & 0x0001);
  }
  p->rc = sqlite3_reset(pIdxSelect);
  sqlite3_bind_null(pIdxSelect, 2);

  if( iPg<pSeg->pgnoFirst ){
    iPg = pSeg->pgnoFirst;
    bDlidx = 0;
  }

  pIter->iLeafPgno = iPg - 1;
  fts5SegIterNextPage(p, pIter);

  if( pIter->pLeaf ){
    fts5LeafSeek(p, bGe, pIter, pTerm, nTerm);
  }

  if( p->rc==SQLITE_OK && bGe==0 ){
    pIter->flags |= FTS5_SEGITER_ONETERM;
    if( pIter->pLeaf ){
      if( flags & FTS5INDEX_QUERY_DESC ){
        pIter->flags |= FTS5_SEGITER_REVERSE;
      }
      if( bDlidx ){
        fts5SegIterLoadDlidx(p, pIter);
      }
      if( flags & FTS5INDEX_QUERY_DESC ){
        fts5SegIterReverse(p, pIter);
      }
    }
  }

  fts5SegIterSetNext(p, pIter);

  /* Either:
  **
  **   1) an error has occurred, or
  **   2) the iterator points to EOF, or
  **   3) the iterator points to an entry with term (pTerm/nTerm), or
  **   4) the FTS5INDEX_QUERY_SCAN flag was set and the iterator points
  **      to an entry with a term greater than or equal to (pTerm/nTerm).
  */
  assert_nc( p->rc!=SQLITE_OK                                       /* 1 */
   || pIter->pLeaf==0                                               /* 2 */
   || fts5BufferCompareBlob(&pIter->term, pTerm, nTerm)==0          /* 3 */
   || (bGe && fts5BufferCompareBlob(&pIter->term, pTerm, nTerm)>0)  /* 4 */
  );
}